

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerResults.cpp
# Opt level: O2

void __thiscall
I2cAnalyzerResults::GenerateFrameTabularText
          (I2cAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  ostream *poVar1;
  char *local_298 [4];
  char ack [32];
  Frame frame;
  byte local_240;
  undefined7 uStack_23f;
  char local_230;
  byte local_22f;
  char number_str [128];
  stringstream ss;
  ostream local_198 [376];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)&frame);
  if ((local_22f & 1) == 0) {
    if ((local_22f & 2) == 0) {
      builtin_strncpy(ack,"NAK",4);
    }
    else {
      builtin_strncpy(ack,"Missing ACK/NAK",0x10);
    }
  }
  else {
    builtin_strncpy(ack,"ACK",4);
  }
  if (local_230 == '\0') {
    AnalyzerHelpers::GetNumberString
              (CONCAT71(uStack_23f,local_240) >> 1,display_base,7,number_str,0x80);
    if ((local_240 & 1) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar1 = std::operator<<(local_198,"Setup Write to [");
      poVar1 = std::operator<<(poVar1,number_str);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddTabularText
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar1 = std::operator<<(local_198,"Setup Read to [");
      poVar1 = std::operator<<(poVar1,number_str);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddTabularText
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    AnalyzerHelpers::GetNumberString(CONCAT71(uStack_23f,local_240),display_base,8,number_str,0x80);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(local_198,number_str);
    poVar1 = std::operator<<(poVar1," + ");
    std::operator<<(poVar1,ack);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddTabularText
              ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  Frame::~Frame(&frame);
  return;
}

Assistant:

void I2cAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    char ack[ 32 ];
    if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "ACK" );
    else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
    else
        snprintf( ack, sizeof( ack ), "NAK" );

    if( frame.mType == I2cAddress )
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );

        I2cDirection direction;
        if( ( frame.mData1 & 0x1 ) != 0 )
            direction = I2C_READ;
        else
            direction = I2C_WRITE;

        if( direction == I2C_READ )
        {
            std::stringstream ss;
            ss << "Setup Read to [" << number_str << "] + " << ack;
            AddTabularText( ss.str().c_str() );
        }
        else
        {
            std::stringstream ss;
            ss << "Setup Write to [" << number_str << "] + " << ack;
            AddTabularText( ss.str().c_str() );
        }
    }
    else
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
        std::stringstream ss;
        ss << number_str << " + " << ack;
        AddTabularText( ss.str().c_str() );
    }
}